

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_manager.cpp
# Opt level: O0

void __thiscall jessilib::impl::parser_manager::unregister_parser(parser_manager *this,id in_id)

{
  reference prVar1;
  undefined1 local_98 [8];
  registration removed_registration;
  _Self local_68 [3];
  registration local_50;
  _Self local_28;
  iterator itr;
  lock_guard<std::shared_mutex> guard;
  id in_id_local;
  parser_manager *this_local;
  
  std::lock_guard<std::shared_mutex>::lock_guard
            ((lock_guard<std::shared_mutex> *)&itr,&this->m_mutex);
  registration::registration(&local_50,in_id);
  local_28._M_node =
       (_Base_ptr)
       std::
       set<jessilib::impl::parser_manager::registration,_std::less<jessilib::impl::parser_manager::registration>,_std::allocator<jessilib::impl::parser_manager::registration>_>
       ::find(&this->m_registrations,&local_50);
  registration::~registration(&local_50);
  local_68[0]._M_node =
       (_Base_ptr)
       std::
       set<jessilib::impl::parser_manager::registration,_std::less<jessilib::impl::parser_manager::registration>,_std::allocator<jessilib::impl::parser_manager::registration>_>
       ::end(&this->m_registrations);
  removed_registration.m_format.field_2._M_local_buf[0xc] = std::operator==(&local_28,local_68);
  if (!(bool)removed_registration.m_format.field_2._M_local_buf[0xc]) {
    prVar1 = std::_Rb_tree_const_iterator<jessilib::impl::parser_manager::registration>::operator*
                       (&local_28);
    registration::registration((registration *)local_98,prVar1);
    std::
    set<jessilib::impl::parser_manager::registration,std::less<jessilib::impl::parser_manager::registration>,std::allocator<jessilib::impl::parser_manager::registration>>
    ::erase_abi_cxx11_((set<jessilib::impl::parser_manager::registration,std::less<jessilib::impl::parser_manager::registration>,std::allocator<jessilib::impl::parser_manager::registration>>
                        *)&this->m_registrations,(const_iterator)local_28._M_node);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>_>_>
    ::erase(&this->m_parsers,(key_type *)&removed_registration);
    registration::~registration((registration *)local_98);
  }
  removed_registration.m_format.field_2._13_3_ = 0;
  std::lock_guard<std::shared_mutex>::~lock_guard((lock_guard<std::shared_mutex> *)&itr);
  return;
}

Assistant:

void parser_manager::unregister_parser(id in_id) {
	std::lock_guard<std::shared_mutex> guard{ m_mutex };

	// Search for registration
	auto itr = m_registrations.find(registration{ in_id });
	if (itr == m_registrations.end()) {
		// Parser already unregistered; do nothing
		return;
	}

	// Unregister
	registration removed_registration = *itr;
	m_registrations.erase(itr);
	m_parsers.erase(removed_registration.m_format);
}